

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool local_bc;
  bool local_bb;
  bool local_ba;
  bool local_b9;
  int local_b8;
  bool local_b4;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  int local_b0;
  bool local_ac;
  bool local_ab;
  bool local_aa;
  bool local_a9;
  int local_a8;
  bool local_a4;
  bool local_a3;
  bool local_a2;
  bool local_a1;
  int local_a0;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  bool local_99;
  bool local_98;
  bool local_97;
  bool local_96;
  bool local_95;
  bool local_94;
  bool local_93;
  bool local_92;
  bool local_91;
  undefined1 local_90 [8];
  UndoHistory history;
  int local_60;
  undefined1 local_50 [8];
  Cmd cmd2;
  Cmd cmd1;
  int model;
  char **argv_local;
  int argc_local;
  
  cmd1.m_undo_value = 0;
  Cmd::Cmd((Cmd *)&cmd2.m_redo_value,&cmd1.m_undo_value,1,0);
  Cmd::Cmd((Cmd *)local_50,&cmd1.m_undo_value,2,1);
  local_60 = 0;
  expect_eq<int,int>(&stack0xffffffffffffffa0,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x14);
  Cmd::redo((Cmd *)&cmd2.m_redo_value);
  history.m_cur._4_4_ = 1;
  expect_eq<int,int>((int *)((long)&history.m_cur + 4),&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x16);
  Cmd::redo((Cmd *)local_50);
  history.m_cur._0_4_ = 2;
  expect_eq<int,int>((int *)&history.m_cur,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x18);
  undo::UndoHistory::UndoHistory((UndoHistory *)local_90,(UndoHistoryDelegate *)0x0);
  local_91 = false;
  local_92 = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_91,&local_92,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1b)
  ;
  local_93 = false;
  local_94 = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_93,&local_94,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1c)
  ;
  undo::UndoHistory::add((UndoHistory *)local_90,(UndoCommand *)&cmd2.m_redo_value);
  local_95 = true;
  local_96 = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_95,&local_96,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1e)
  ;
  local_97 = false;
  local_98 = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_97,&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x1f)
  ;
  undo::UndoHistory::add((UndoHistory *)local_90,(UndoCommand *)local_50);
  local_99 = true;
  local_9a = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_99,&local_9a,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x21)
  ;
  local_9b = false;
  local_9c = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_9b,&local_9c,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x22)
  ;
  undo::UndoHistory::undo((UndoHistory *)local_90);
  local_a0 = 1;
  expect_eq<int,int>(&local_a0,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x25);
  local_a1 = true;
  local_a2 = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_a1,&local_a2,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x26)
  ;
  local_a3 = true;
  local_a4 = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_a3,&local_a4,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x27)
  ;
  undo::UndoHistory::undo((UndoHistory *)local_90);
  local_a8 = 0;
  expect_eq<int,int>(&local_a8,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x29);
  local_a9 = false;
  local_aa = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_a9,&local_aa,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2a)
  ;
  local_ab = true;
  local_ac = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_ab,&local_ac,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2b)
  ;
  undo::UndoHistory::redo((UndoHistory *)local_90);
  local_b0 = 1;
  expect_eq<int,int>(&local_b0,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x2e);
  local_b1 = true;
  local_b2 = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_b1,&local_b2,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x2f)
  ;
  local_b3 = true;
  local_b4 = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_b3,&local_b4,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x30)
  ;
  undo::UndoHistory::redo((UndoHistory *)local_90);
  local_b8 = 2;
  expect_eq<int,int>(&local_b8,&cmd1.m_undo_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp"
                     ,0x32);
  local_b9 = true;
  local_ba = undo::UndoHistory::canUndo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_b9,&local_ba,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x33)
  ;
  local_bb = false;
  local_bc = undo::UndoHistory::canRedo((UndoHistory *)local_90);
  expect_eq<bool,bool>
            (&local_bb,&local_bc,
             "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/tests/basics.cpp",0x34)
  ;
  undo::UndoHistory::~UndoHistory((UndoHistory *)local_90);
  Cmd::~Cmd((Cmd *)local_50);
  Cmd::~Cmd((Cmd *)&cmd2.m_redo_value);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
  int model = 0;
  Cmd cmd1(model, 1, 0);
  Cmd cmd2(model, 2, 1);

  EXPECT_EQ(0, model);
  cmd1.redo();
  EXPECT_EQ(1, model);
  cmd2.redo();
  EXPECT_EQ(2, model);

  UndoHistory history;
  EXPECT_FALSE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
  history.add(&cmd1);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
  history.add(&cmd2);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());

  history.undo();
  EXPECT_EQ(1, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_TRUE(history.canRedo());
  history.undo();
  EXPECT_EQ(0, model);
  EXPECT_FALSE(history.canUndo());
  EXPECT_TRUE(history.canRedo());

  history.redo();
  EXPECT_EQ(1, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_TRUE(history.canRedo());
  history.redo();
  EXPECT_EQ(2, model);
  EXPECT_TRUE(history.canUndo());
  EXPECT_FALSE(history.canRedo());
}